

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O1

DdNode * Extra_zddTuplesFromBdd(DdManager *dd,int K,DdNode *bVarsN)

{
  int iVar1;
  bool bVar2;
  DdNode *in_RAX;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  
  iVar1 = dd->autoDynZ;
  dd->autoDynZ = 0;
  do {
    pDVar5 = dd->one;
    iVar3 = 0;
    if (pDVar5 != bVarsN) {
      iVar3 = 0;
      pDVar6 = bVarsN;
      do {
        if ((pDVar6->type).kids.E != (DdNode *)((ulong)pDVar5 ^ 1)) goto LAB_00803689;
        iVar3 = iVar3 + 1;
        pDVar6 = (pDVar6->type).kids.T;
      } while (pDVar6 != pDVar5);
    }
    iVar4 = iVar3 - K;
    if (iVar3 < K) {
LAB_00803689:
      bVar2 = false;
    }
    else {
      pDVar5 = bVarsN;
      if (iVar4 != 0 && K <= iVar3) {
        do {
          pDVar5 = (pDVar5->type).kids.T;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      dd->reordered = 0;
      in_RAX = extraZddTuplesFromBdd(dd,pDVar5,bVarsN);
      bVar2 = true;
    }
    if (!bVar2) {
      return (DdNode *)0x0;
    }
    if (dd->reordered != 1) {
      dd->autoDynZ = iVar1;
      return in_RAX;
    }
  } while( true );
}

Assistant:

DdNode* Extra_zddTuplesFromBdd( 
  DdManager * dd,   /* the DD manager */
  int K,            /* the number of variables in tuples */
  DdNode * bVarsN)   /* the set of all variables represented as a BDD */
{
    DdNode  *zRes;
    int     autoDynZ;

    autoDynZ = dd->autoDynZ;
    dd->autoDynZ = 0;

    do {
        /* transform the numeric arguments (K) into a DdNode* argument;
         * this allows us to use the standard internal CUDD cache */
        DdNode *bVarSet = bVarsN, *bVarsK = bVarsN;
        int     nVars = 0, i;

        /* determine the number of variables in VarSet */
        while ( bVarSet != b1 )
        {
            nVars++;
            /* make sure that the VarSet is a cube */
            if ( cuddE( bVarSet ) != b0 )
                return NULL;
            bVarSet = cuddT( bVarSet );
        }
        /* make sure that the number of variables in VarSet is less or equal 
           that the number of variables that should be present in the tuples
        */
        if ( K > nVars )
            return NULL;

        /* the second argument in the recursive call stannds for <n>;
         * reate the first argument, which stands for <k>
         * as when we are talking about the tuple of <k> out of <n> */
        for ( i = 0; i < nVars-K; i++ )
            bVarsK = cuddT( bVarsK );

        dd->reordered = 0;
        zRes = extraZddTuplesFromBdd(dd, bVarsK, bVarsN );

    } while (dd->reordered == 1);
    dd->autoDynZ = autoDynZ;
    return zRes;

}